

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

bool __thiscall Lowerer::GenerateFastInlineStringFromCodePoint(Lowerer *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  ArgSlot AVar3;
  undefined4 *puVar4;
  SymOpnd *pSVar5;
  StackSym *this_00;
  Opnd *pOVar6;
  LabelInstr *doneLabel_00;
  LabelInstr *labelFail;
  undefined1 local_80 [8];
  AutoReuseOpnd autoReuseFromCodePointIntArgOpnd;
  RegOpnd *fromCodePointIntArgOpnd;
  LabelInstr *labelHelper;
  LabelInstr *doneLabel;
  RegOpnd *resultOpnd;
  Opnd *local_40;
  Opnd *src1;
  Instr *argInstr;
  IntConstType argCount;
  Instr *tmpInstr;
  Opnd *linkOpnd;
  Instr *instr_local;
  Lowerer *this_local;
  
  linkOpnd = (Opnd *)instr;
  instr_local = (Instr *)this;
  if (instr->m_opcode != CallDirect) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4d7e,"(instr->m_opcode == Js::OpCode::CallDirect)",
                       "instr->m_opcode == Js::OpCode::CallDirect");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  tmpInstr = (Instr *)IR::Instr::GetSrc2((Instr *)linkOpnd);
  argCount = (IntConstType)Inline::GetDefInstr((Opnd *)tmpInstr);
  tmpInstr = (Instr *)IR::Instr::GetSrc2((Instr *)argCount);
  pSVar5 = IR::Opnd::AsSymOpnd((Opnd *)tmpInstr);
  this_00 = Sym::AsStackSym(pSVar5->m_sym);
  AVar3 = StackSym::GetArgSlotNum(this_00);
  argInstr = (Instr *)(ulong)AVar3;
  if (argInstr != (Instr *)0x2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4d8d,"(argCount == 2)","argCount == 2");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  src1 = (Opnd *)Inline::GetDefInstr((Opnd *)tmpInstr);
  if (((Instr *)src1)->m_opcode != ArgOut_A) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4d91,"(argInstr->m_opcode == Js::OpCode::ArgOut_A)",
                       "argInstr->m_opcode == Js::OpCode::ArgOut_A");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  local_40 = IR::Instr::GetSrc1((Instr *)src1);
  resultOpnd._6_2_ =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       IR::Opnd::GetValueType(local_40);
  bVar2 = ValueType::IsLikelyInt((ValueType *)((long)&resultOpnd + 6));
  if (!bVar2) {
    return true;
  }
  pOVar6 = IR::Instr::GetDst((Instr *)linkOpnd);
  bVar2 = IR::Opnd::IsRegOpnd(pOVar6);
  if (bVar2) {
    pOVar6 = IR::Instr::GetDst((Instr *)linkOpnd);
    bVar2 = IR::Opnd::IsEqual(pOVar6,local_40);
    if (!bVar2) {
      pOVar6 = IR::Instr::GetDst((Instr *)linkOpnd);
      doneLabel = (LabelInstr *)IR::Opnd::AsRegOpnd(pOVar6);
      goto LAB_007934dd;
    }
  }
  doneLabel = (LabelInstr *)IR::RegOpnd::New(TyVar,this->m_func);
LAB_007934dd:
  doneLabel_00 = IR::LabelInstr::New(Label,this->m_func,false);
  labelFail = IR::LabelInstr::New(Label,this->m_func,true);
  autoReuseFromCodePointIntArgOpnd._16_8_ = IR::RegOpnd::New(TyVar,(Func *)linkOpnd[2]._vptr_Opnd);
  IR::AutoReuseOpnd::AutoReuseOpnd
            ((AutoReuseOpnd *)local_80,(Opnd *)autoReuseFromCodePointIntArgOpnd._16_8_,
             (Func *)linkOpnd[2]._vptr_Opnd,true);
  InsertMove((Opnd *)autoReuseFromCodePointIntArgOpnd._16_8_,local_40,(Instr *)linkOpnd,true);
  autoReuseFromCodePointIntArgOpnd._16_8_ =
       GenerateUntagVar(this,(RegOpnd *)autoReuseFromCodePointIntArgOpnd._16_8_,labelFail,
                        (Instr *)linkOpnd,true);
  GenerateGetSingleCharString
            (this,(RegOpnd *)autoReuseFromCodePointIntArgOpnd._16_8_,(Opnd *)doneLabel,labelFail,
             doneLabel_00,(Instr *)linkOpnd,true);
  IR::Instr::InsertBefore((Instr *)linkOpnd,&labelFail->super_Instr);
  IR::Instr::InsertAfter((Instr *)linkOpnd,&doneLabel_00->super_Instr);
  RelocateCallDirectToHelperPath(this,(Instr *)argCount,labelFail);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_80);
  return true;
}

Assistant:

bool
Lowerer::GenerateFastInlineStringFromCodePoint(IR::Instr* instr)
{
    Assert(instr->m_opcode == Js::OpCode::CallDirect);

//  ArgOut sequence
//  s8.var          =  StartCall      2 (0x2).i32                             #000c
//  arg1(s9)<0>.var =  ArgOut_A       s2.var, s8.var                          #0014 //Implicit this, String object
//  arg2(s10)<4>.var = ArgOut_A       s3.var, arg1(s9)<0>.var                 #0018 //First argument to FromCharCode
//  arg1(s11)<0>.u32 = ArgOut_A_InlineSpecialized  0x012C26C0 (DynamicObject).var, arg2(s10)<4>.var #
//  s0[LikelyTaggedInt].var = CallDirect  String_FromCodePoint.u32, arg1(s11)<0>.u32 #001c

    IR::Opnd * linkOpnd = instr->GetSrc2();
    IR::Instr * tmpInstr = Inline::GetDefInstr(linkOpnd);// linkOpnd->AsSymOpnd()->m_sym->AsStackSym()->m_instrDef;
    linkOpnd = tmpInstr->GetSrc2();

#if DBG
    IntConstType argCount = linkOpnd->AsSymOpnd()->m_sym->AsStackSym()->GetArgSlotNum();
    Assert(argCount == 2);
#endif

    IR::Instr *argInstr = Inline::GetDefInstr(linkOpnd);
    Assert(argInstr->m_opcode == Js::OpCode::ArgOut_A);
    IR::Opnd *src1 = argInstr->GetSrc1();

    if (src1->GetValueType().IsLikelyInt())
    {
        //Trying to generate this code
        //      MOV resultOpnd, dst
        //      MOV fromCharCodeIntArgOpnd, src1
        //      SAR fromCharCodeIntArgOpnd, Js::VarTag_Shift
        //      JAE $Helper
        //      CMP fromCharCodeIntArgOpnd, Js::ScriptContext::CharStringCacheSize
        //
        //      JAE $labelWCharStringCheck                                   <
        //      MOV resultOpnd, GetCharStringCache[fromCharCodeIntArgOpnd]
        //      TST resultOpnd, resultOpnd          //Check for null
        //      JEQ $helper
        //      JMP $Done
        //
        //$labelWCharStringCheck:
        //      resultOpnd =  Call HelperGetStringForCharW
        //      JMP $Done
        //$helper:
        IR::RegOpnd * resultOpnd = nullptr;
        if (!instr->GetDst()->IsRegOpnd() || instr->GetDst()->IsEqual(src1))
        {
            resultOpnd = IR::RegOpnd::New(TyVar, this->m_func);
        }
        else
        {
            resultOpnd = instr->GetDst()->AsRegOpnd();
        }

        IR::LabelInstr *doneLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
        IR::LabelInstr *labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);

        IR::RegOpnd * fromCodePointIntArgOpnd = IR::RegOpnd::New(TyVar, instr->m_func);
        IR::AutoReuseOpnd autoReuseFromCodePointIntArgOpnd(fromCodePointIntArgOpnd, instr->m_func);
        InsertMove(fromCodePointIntArgOpnd, src1, instr);

        //Check for tagged int and get the untagged version.
        fromCodePointIntArgOpnd = GenerateUntagVar(fromCodePointIntArgOpnd, labelHelper, instr);

        GenerateGetSingleCharString(fromCodePointIntArgOpnd, resultOpnd, labelHelper, doneLabel, instr, true);

        instr->InsertBefore(labelHelper);

        instr->InsertAfter(doneLabel);

        RelocateCallDirectToHelperPath(tmpInstr, labelHelper);
    }
    return true;
}